

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O2

string * __thiscall
ExpressionInternal::toString_abi_cxx11_(string *__return_storage_ptr__,ExpressionInternal *this)

{
  long *args;
  string *psVar1;
  double *args_00;
  uint *args_01;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string result;
  string local_70;
  string local_50;
  string local_30;
  
  args_01 = &switchD_0016a74c::switchdataD_0017ee6c;
  switch(this->type) {
  case Integer:
    args = valueAs<long>(this);
    tinyformat::format<long>(__return_storage_ptr__,"%d",args);
    return __return_storage_ptr__;
  case Float:
    args_00 = valueAs<double>(this);
    tinyformat::format<double>(__return_storage_ptr__,"%g",args_00);
    return __return_storage_ptr__;
  case Identifier:
    psVar1 = (string *)valueAs<Identifier>(this);
    std::__cxx11::string::string((string *)__return_storage_ptr__,psVar1);
    return __return_storage_ptr__;
  case String:
    psVar1 = (string *)valueAs<StringLiteral>(this);
    std::__cxx11::string::string((string *)&local_70,psVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"\\\\",(allocator<char> *)&local_30);
    replaceAll(&local_70,"\\",&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"\\\"",(allocator<char> *)&local_30);
    replaceAll(&local_70,"\"",&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    tinyformat::format<std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)0x18231e,(char *)psVar1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_01);
    goto LAB_0016ae29;
  case MemoryPos:
    __s = ".";
    goto LAB_0016adb3;
  case Add:
    toString_abi_cxx11_(&local_70,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_50,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s + %s)",(char *)&local_70,&local_50,in_R8);
    break;
  case Sub:
    toString_abi_cxx11_(&local_70,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_50,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s - %s)",(char *)&local_70,&local_50,in_R8);
    break;
  case Mult:
    toString_abi_cxx11_(&local_70,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_50,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s * %s)",(char *)&local_70,&local_50,in_R8);
    break;
  case Div:
    toString_abi_cxx11_(&local_70,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_50,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s / %s)",(char *)&local_70,&local_50,in_R8);
    break;
  case Mod:
    toString_abi_cxx11_(&local_70,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_50,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s %% %s)",(char *)&local_70,&local_50,in_R8);
    break;
  case Neg:
    toString_abi_cxx11_(&local_70,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(-%s)",(char *)&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_01);
    goto LAB_0016ae29;
  case LogNot:
    toString_abi_cxx11_(&local_70,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(!%s)",(char *)&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_01);
    goto LAB_0016ae29;
  case BitNot:
    toString_abi_cxx11_(&local_70,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(~%s)",(char *)&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_01);
    goto LAB_0016ae29;
  case LeftShift:
    toString_abi_cxx11_(&local_70,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_50,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s << %s)",(char *)&local_70,&local_50,in_R8);
    break;
  case RightShift:
    toString_abi_cxx11_(&local_70,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_50,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s >> %s)",(char *)&local_70,&local_50,in_R8);
    break;
  case Less:
    toString_abi_cxx11_(&local_70,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_50,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s < %s)",(char *)&local_70,&local_50,in_R8);
    break;
  case Greater:
    toString_abi_cxx11_(&local_70,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_50,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s > %s)",(char *)&local_70,&local_50,in_R8);
    break;
  case LessEqual:
    toString_abi_cxx11_(&local_70,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_50,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s <= %s)",(char *)&local_70,&local_50,in_R8);
    break;
  case GreaterEqual:
    toString_abi_cxx11_(&local_70,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_50,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s >= %s)",(char *)&local_70,&local_50,in_R8);
    break;
  case Equal:
    toString_abi_cxx11_(&local_70,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_50,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s == %s)",(char *)&local_70,&local_50,in_R8);
    break;
  case NotEqual:
    toString_abi_cxx11_(&local_70,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_50,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s != %s)",(char *)&local_70,&local_50,in_R8);
    break;
  case BitAnd:
    toString_abi_cxx11_(&local_70,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_50,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s & %s)",(char *)&local_70,&local_50,in_R8);
    break;
  case Xor:
    toString_abi_cxx11_(&local_70,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_50,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s ^ %s)",(char *)&local_70,&local_50,in_R8);
    break;
  case BitOr:
    toString_abi_cxx11_(&local_70,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_50,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s | %s)",(char *)&local_70,&local_50,in_R8);
    break;
  case LogAnd:
    toString_abi_cxx11_(&local_70,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_50,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s && %s)",(char *)&local_70,&local_50,in_R8);
    break;
  case LogOr:
    toString_abi_cxx11_(&local_70,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_50,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s || %s)",(char *)&local_70,&local_50,in_R8);
    break;
  case TertiaryIf:
    toString_abi_cxx11_(&local_70,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_50,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_30,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[2]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s ? %s : %s)",(char *)&local_70,&local_50,
               &local_30,in_R9);
    std::__cxx11::string::~string((string *)&local_30);
    break;
  case ToString:
    convertUnicodeCharToUtf8_abi_cxx11_(&local_70,L'°');
    toString_abi_cxx11_(&local_50,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s%s)",(char *)&local_70,&local_50,in_R8);
    break;
  case FunctionCall:
    formatFunctionCall_abi_cxx11_(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  default:
    __s = "";
LAB_0016adb3:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_70);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)&local_50);
LAB_0016ae29:
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string ExpressionInternal::toString()
{
	switch (type)
	{
	case OperatorType::Integer:
		return tfm::format("%d",valueAs<int64_t>());
	case OperatorType::Float:
		return tfm::format("%g",valueAs<double>());
	case OperatorType::Identifier:
		return valueAs<Identifier>().string();
	case OperatorType::String:
		return escapeString(valueAs<StringLiteral>().string());
	case OperatorType::MemoryPos:
		return ".";
	case OperatorType::Add:
		return tfm::format("(%s + %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::Sub:
		return tfm::format("(%s - %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::Mult:
		return tfm::format("(%s * %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::Div:
		return tfm::format("(%s / %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::Mod:
		return tfm::format("(%s %% %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::Neg:
		return tfm::format("(-%s)",children[0]->toString());
	case OperatorType::LogNot:
		return tfm::format("(!%s)",children[0]->toString());
	case OperatorType::BitNot:
		return tfm::format("(~%s)",children[0]->toString());
	case OperatorType::LeftShift:
		return tfm::format("(%s << %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::RightShift:
		return tfm::format("(%s >> %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::Less:
		return tfm::format("(%s < %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::Greater:
		return tfm::format("(%s > %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::LessEqual:
		return tfm::format("(%s <= %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::GreaterEqual:
		return tfm::format("(%s >= %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::Equal:
		return tfm::format("(%s == %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::NotEqual:
		return tfm::format("(%s != %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::BitAnd:
		return tfm::format("(%s & %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::BitOr:
		return tfm::format("(%s | %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::LogAnd:
		return tfm::format("(%s && %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::LogOr:
		return tfm::format("(%s || %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::Xor:
		return tfm::format("(%s ^ %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::TertiaryIf:
		return tfm::format("(%s ? %s : %s)",children[0]->toString(),children[1]->toString(),children[2]->toString());
	case OperatorType::ToString:
		return tfm::format("(%s%s)",convertUnicodeCharToUtf8(u'\u00B0'),children[0]->toString());
	case OperatorType::FunctionCall:
		return formatFunctionCall();
	default:
		return "";
	}
}